

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.h
# Opt level: O0

void __thiscall
TextFile::writeFormat<unsigned_long,char_const*>
          (TextFile *this,char *text,unsigned_long *args,char **args_1)

{
  void *__buf;
  char **in_R8;
  undefined1 local_48 [8];
  string message;
  char **args_local_1;
  unsigned_long *args_local;
  char *text_local;
  TextFile *this_local;
  
  message.field_2._8_8_ = args_1;
  tinyformat::format<unsigned_long,char_const*>
            ((string *)local_48,(tinyformat *)text,(char *)args,(unsigned_long *)args_1,in_R8);
  write(this,(int)(string *)local_48,__buf,(size_t)args_1);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void writeFormat(const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		write(message);
	}